

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

float trng::math::Phi(float x)

{
  float fVar1;
  
  fVar1 = x * 0.70710677;
  if (-0.47693625 <= fVar1) {
    if (fVar1 <= 0.47693625) {
      fVar1 = erff(fVar1);
      fVar1 = fVar1 * 0.5 + 0.5;
    }
    else {
      fVar1 = erfcf(fVar1);
      fVar1 = fVar1 * -0.5 + 1.0;
    }
  }
  else {
    fVar1 = erfcf(-fVar1);
    fVar1 = fVar1 * 0.5;
  }
  return fVar1;
}

Assistant:

TRNG_CUDA_ENABLE
    inline float Phi(float x) {
      x *= constants<float>::one_over_sqrt_2;
      if (x < -0.6744897501960817f * constants<float>::one_over_sqrt_2)
        return 0.5f * erfc(-x);
      if (x > +0.6744897501960817f * constants<float>::one_over_sqrt_2)
        return 1.0f - 0.5f * erfc(x);
      return 0.5f + 0.5f * erf(x);
    }